

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.hpp
# Opt level: O0

void __thiscall
trex::
hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
register_type<Circle>
          (hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,t_type_info<Circle> *ti)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  reference __dest;
  type_info *t;
  iterator __end0;
  iterator __begin0;
  vector<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  *__range3;
  type_info new_type_info;
  lock_guard l;
  t_type_info<Circle> *ti_local;
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  priv::lock_guard::lock_guard
            ((lock_guard *)((long)&new_type_info.construct_at_a + 7),(mutex *)this);
  type_info::type_info((type_info *)&__range3);
  memcpy(&__range3,ti,0x38);
  new_type_info.super_type_info.destroy = as_base<Circle>;
  new_type_info.alloc_and_construct_a = construct_at_a<Circle>;
  new_type_info.as_base = alloc_and_construct_a<Circle>;
  __end0 = std::
           vector<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
           ::begin(&this->m_registered_types);
  t = (type_info *)
      std::
      vector<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
      ::end(&this->m_registered_types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info_*,_std::vector<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>_>
                                *)&t);
    if (!bVar1) {
      std::
      vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
      ::emplace_back<trex::hierarchy<Shape,std::__cxx11::string>::type_info>
                ((vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
                  *)&this->m_registered_types,(type_info *)&__range3);
      return;
    }
    __dest = __gnu_cxx::
             __normal_iterator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info_*,_std::vector<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>_>
             ::operator*(&__end0);
    __x._M_len = (__dest->super_type_info).name._M_len;
    __x._M_str = (__dest->super_type_info).name._M_str;
    __y._M_len = (ti->super_type_info).name._M_len;
    __y._M_str = (ti->super_type_info).name._M_str;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info_*,_std::vector<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>_>
    ::operator++(&__end0);
  }
  memcpy(__dest,&__range3,0x50);
  return;
}

Assistant:

void register_type(const t_type_info<T>& ti)
    {
        static_assert(std::is_base_of<Base, T>::value, "Not a base class");

        priv::lock_guard l(m_register_mutex);

        type_info new_type_info;
        static_cast<trex::type_info&>(new_type_info) = ti;
        new_type_info.as_base = as_base<T>;
        new_type_info.construct_at_a = construct_at_a<T>;
        new_type_info.alloc_and_construct_a = alloc_and_construct_a<T>;

        // here we don't simply add the to the list
        // to support plugins and hot reloading, we override existing types
        for (auto& t : m_registered_types)
        {
            if (t.name == ti.name)
            {
                t = std::move(new_type_info);
                return;
            }
        }

        // type was not found, so add
        m_registered_types.emplace_back(std::move(new_type_info));
    }